

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

shared_ptr<polyscope::render::AttributeBuffer> __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::
getIndexedRenderAttributeBuffer
          (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *this,
          ManagedBuffer<unsigned_int> *indices)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<ManagedBuffer<uint32_t>_*,_weak_ptr<AttributeBuffer>_>_> *ppMVar2;
  element_type *peVar3;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  weak_ptr<polyscope::render::AttributeBuffer> *in_RSI;
  Engine *in_RDI;
  shared_ptr<polyscope::render::AttributeBuffer> sVar5;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  expandData;
  ManagedBuffer<unsigned_int> *indexBufferCand;
  tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
  *existingViewTup;
  iterator __end2;
  iterator __begin2;
  vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  *__range2;
  shared_ptr<polyscope::render::AttributeBuffer> *newBuffer;
  Engine *__args_1;
  undefined1 local_78 [40];
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar7;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_*,_std::vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>_>
  local_28;
  weak_ptr<polyscope::render::AttributeBuffer> *local_20;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_18;
  
  __args_1 = in_RDI;
  local_18 = in_RDX;
  checkDeviceBufferTypeIs
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             expandData.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             expandData.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish._4_4_);
  removeDeletedIndexedViews
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_20 = in_RSI + 10;
  local_28._M_current =
       (tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
        *)std::
          vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
          ::begin((vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
                   *)in_RDI);
  std::
  vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
  ::end((vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
         *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_*,_std::vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>_>
                             *)__args_1,
                            (__normal_iterator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_*,_std::vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>_>
                             *)in_RDI), bVar1) {
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_*,_std::vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>_>
         ::operator*(&local_28);
    in_stack_ffffffffffffffc7 = 0;
    std::
    get<1ul,polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>
              ((tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                *)0x416d6d);
    std::weak_ptr<polyscope::render::AttributeBuffer>::lock(in_RSI);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
    _Var4._M_pi = extraout_RDX;
    if ((bVar1) &&
       (ppMVar2 = std::
                  get<0ul,polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>
                            ((tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                              *)0x416d92), _Var4._M_pi = extraout_RDX_00,
       (pointer)(*ppMVar2)->uniqueID ==
       local_18[1].
       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
      in_stack_ffffffffffffffc7 = 1;
      iVar7 = 1;
    }
    else {
      iVar7 = 0;
    }
    if ((in_stack_ffffffffffffffc7 & 1) == 0) {
      std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
                ((shared_ptr<polyscope::render::AttributeBuffer> *)0x416dda);
      _Var4._M_pi = extraout_RDX_01;
    }
    if (iVar7 != 0) goto LAB_00416ef1;
    __gnu_cxx::
    __normal_iterator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_*,_std::vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>_>
    ::operator++(&local_28);
  }
  ensureHostBufferPopulated
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             expandData.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  generateAttributeBuffer<glm::vec<3,float,(glm::qualifier)0>>(in_RDI);
  ManagedBuffer<unsigned_int>::ensureHostBufferPopulated
            ((ManagedBuffer<unsigned_int> *)
             expandData.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  gather<glm::vec<3,float,(glm::qualifier)0>>
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)in_stack_ffffffffffffffc8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  peVar3 = std::
           __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x416e55);
  (*peVar3->_vptr_AttributeBuffer[3])(peVar3,local_78);
  std::
  vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>,std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>*,std::weak_ptr<polyscope::render::AttributeBuffer>>>>
  ::
  emplace_back<polyscope::render::ManagedBuffer<unsigned_int>*,std::shared_ptr<polyscope::render::AttributeBuffer>&>
            ((vector<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
              *)local_18,(ManagedBuffer<unsigned_int> **)in_RSI,
             (shared_ptr<polyscope::render::AttributeBuffer> *)__args_1);
  uVar6 = 0x1000000;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector(local_18);
  _Var4._M_pi = extraout_RDX_02;
  if ((uVar6 & 0x1000000) == 0) {
    std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
              ((shared_ptr<polyscope::render::AttributeBuffer> *)0x416ee4);
    _Var4._M_pi = extraout_RDX_03;
  }
LAB_00416ef1:
  sVar5.super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__args_1;
  return (shared_ptr<polyscope::render::AttributeBuffer>)
         sVar5.super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<render::AttributeBuffer>
ManagedBuffer<T>::getIndexedRenderAttributeBuffer(ManagedBuffer<uint32_t>& indices) {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  removeDeletedIndexedViews(); // periodic filtering

  // Check if we have already created this indexed view, and if so just return it
  for (std::tuple<render::ManagedBuffer<uint32_t>*, std::weak_ptr<render::AttributeBuffer>>& existingViewTup :
       existingIndexedViews) {

    // both the cache-key source index ptr and the view buffer ptr must still be alive (and the index must match)
    // note that we can't verify that the index buffer is still alive, you will just get memory errors here if it
    // has been deleted
    std::shared_ptr<render::AttributeBuffer> viewBufferPtr = std::get<1>(existingViewTup).lock();
    if (viewBufferPtr) {
      render::ManagedBuffer<uint32_t>& indexBufferCand = *(std::get<0>(existingViewTup));
      if (indexBufferCand.uniqueID == indices.uniqueID) {
        return viewBufferPtr;
      }
    }
  }

  // We don't have it. Create a new one and return that.
  ensureHostBufferPopulated();
  std::shared_ptr<render::AttributeBuffer> newBuffer = generateAttributeBuffer<T>(render::engine);
  indices.ensureHostBufferPopulated();
  std::vector<T> expandData = gather(data, indices.data);
  newBuffer->setData(expandData); // initially populate
  existingIndexedViews.emplace_back(&indices, newBuffer);

  return newBuffer;
}